

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O1

bool is_valid(Date *d)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = d->y;
  if (0 < (int)uVar1) {
    uVar2 = d->m;
    iVar3 = d->d;
    if (0 < iVar3 && uVar2 - 1 < 0xc) {
      if ((((byte)(0x5ab >> ((byte)uVar2 & 0x1f)) | 0xb < uVar2) & iVar3 < 0x20) != 0) {
        return true;
      }
      if (((byte)(0xa50 >> ((byte)uVar2 & 0x1f)) & uVar2 < 0xc & iVar3 < 0x1f) != 0) {
        return true;
      }
      if (uVar2 == 2) {
        if ((uVar1 & 3) == 0) {
          bVar4 = true;
          if ((uVar1 * -0x3d70a3d7 >> 2 | uVar1 * 0x40000000) < 0x28f5c29) {
            bVar4 = (uVar1 * -0x3d70a3d7 >> 4 | uVar1 * -0x70000000) < 0xa3d70b;
          }
        }
        else {
          bVar4 = false;
        }
        if ((bool)(bVar4 & iVar3 < 0x1e)) {
          return true;
        }
      }
      return iVar3 < 0x1d;
    }
  }
  return false;
}

Assistant:

bool is_valid(const Date& d)
{
	bool is_valid = d.y > 0 && (d.m > 0 && d.m < 13) && d.d > 0;
	is_valid = is_valid && (
		(is_31_day_month(d.m) && d.d < 32) ||
		(is_30_day_month(d.m) && d.d < 31) ||
		(d.m == 2 && (is_leap(d) && d.d < 30) || d.d < 29)
		);
	return is_valid;
}